

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 __thiscall svg::Color::toString_abi_cxx11_(Color *this,Layout *param_2)

{
  ostream *poVar1;
  long in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    poVar1 = std::operator<<(local_190,"rgb(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0xc));
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x10));
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x14));
    std::operator<<(poVar1,")");
  }
  else {
    std::operator<<(local_190,"none");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(Layout const &) const
        {
            std::stringstream ss;
            if (transparent)
                ss << "none";
            else
                ss << "rgb(" << red << "," << green << "," << blue << ")";
            return ss.str();
        }